

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O2

Result __thiscall
tonk::UDPSocket::Initialize
          (UDPSocket *this,Dependencies *deps,IPVersion bindIPVersion,uint16_t port,
          TonkSocketConfig *socketConfig,TonkSocket apiTonkSocket,
          shared_ptr<asio::io_context::strand> asioConnectStrand)

{
  int *piVar1;
  Dependencies *this_00;
  ostringstream *this_01;
  undefined2 uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>> *this_02;
  recursive_mutex *this_03;
  undefined8 uVar6;
  uint64_t y;
  _func_int **pp_Var7;
  OutputWorker *this_04;
  undefined8 *puVar8;
  uint8_t *readBuffer;
  socklen_t __len;
  undefined6 in_register_0000000a;
  undefined4 in_register_00000014;
  data_union *this_05;
  address *this_06;
  _func_int *p_Var9;
  BufferAllocator *pBVar10;
  char *__rhs;
  long lVar11;
  bool bVar12;
  error_code ec;
  unsigned_short local_260;
  error_code ec_1;
  UDPAddress local_ep;
  string local_228;
  data_union local_200;
  error_category *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  address bindAddr;
  
  Dependencies::operator=
            ((Dependencies *)&deps[1].MappedPortPtr,
             (Dependencies *)CONCAT44(in_register_00000014,bindIPVersion));
  deps[2].MappedPortPtr = (shared_ptr<tonk::gateway::MappedPortLifetime> *)apiTonkSocket;
  deps[2].IdMap =
       (ConnectionIdMap *)
       asioConnectStrand.super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::__shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2> *)&deps[3].NATPool,
             (__shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2> *)
             asioConnectStrand.
             super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  LOCK();
  *(undefined1 *)&deps[3].SocketRefCount = 0;
  UNLOCK();
  y = siamese::GetTimeUsec();
  siamese::PCGRandom::Seed((PCGRandom *)&deps[3].MappedPortPtr,y,0);
  (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)0x0;
  __len = *(socklen_t *)(apiTonkSocket + 0x28);
  FloodDetector::Initialize
            ((FloodDetector *)&bindAddr,(int)deps + 0x120,*(uint *)(apiTonkSocket + 0x24));
  uVar6 = bindAddr._0_8_;
  bindAddr.type_ = ipv4;
  bindAddr.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)uVar6;
  Result::~Result((Result *)&bindAddr);
  if ((this->super_IUDPSender)._vptr_IUDPSender != (_func_int **)0x0) goto LAB_0012a5bc;
  MakeUniqueNoThrow<asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>,asio::io_context&>
            ((tonk *)&bindAddr,(io_context *)deps[2].SocketRefCount);
  uVar6 = bindAddr._0_8_;
  this_00 = deps + 3;
  bindAddr.type_ = ipv4;
  bindAddr.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  std::
  __uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::reset((__uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           *)this_00,(pointer)uVar6);
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::~unique_ptr((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                 *)&bindAddr);
  pBVar10 = deps[3].ReadBufferAllocator;
  if (pBVar10 == (BufferAllocator *)0x0) {
    Result::OutOfMemory();
LAB_0012a478:
    uVar6 = bindAddr._0_8_;
    bindAddr.type_ = ipv4;
    bindAddr.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)uVar6;
    Result::~Result((Result *)&bindAddr);
    goto LAB_0012a5b2;
  }
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  local_228.field_2._8_4_ = 0;
  local_228._M_string_length._0_4_ = 0;
  local_228._M_string_length._4_4_ = 0;
  local_228.field_2._M_allocated_capacity._0_4_ = 0;
  local_228.field_2._M_allocated_capacity._4_4_ = 0;
  local_228._M_dataplus._M_p = (pointer)0x2;
  local_260 = (unsigned_short)socketConfig;
  local_1e0 = ec._M_cat;
  if (*(char **)(apiTonkSocket + 0x40) == (char *)0x0) {
    bVar12 = (int)CONCAT62(in_register_0000000a,port) == 1;
    __len = (int)&local_228 + 8;
    bindAddr.type_ = ipv4;
    bindAddr.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    bindAddr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    bindAddr.ipv6_address_.addr_.__in6_u.__u6_addr32[2] = 0;
    local_228._M_dataplus._M_p._2_2_ = swap_bytes(local_260);
    local_228._M_dataplus._M_p._0_2_ = (ushort)!bVar12 * 8 + 2;
    local_228._M_dataplus._M_p._4_4_ = 0;
    local_228.field_2._8_4_ = 0;
    local_228._M_string_length._0_4_ = 0;
    local_228._M_string_length._4_4_ = 0;
    local_228.field_2._M_allocated_capacity._0_4_ = 0;
    local_228.field_2._M_allocated_capacity._4_4_ = 0;
LAB_0012a515:
    bindAddr.type_ = (uint)(bVar12 ^ 1) * 8 + 2;
    asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::open
              ((basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)pBVar10
               ,(char *)&bindAddr,(int)&ec);
    if (ec._M_value != 0) {
      (**(code **)(*(long *)ec._M_cat + 0x20))(&bindAddr);
      iVar3 = ec._M_value;
      pp_Var7 = (_func_int **)operator_new(0x38);
      *pp_Var7 = (_func_int *)"UDP socket open failed";
      std::__cxx11::string::string((string *)(pp_Var7 + 1),(string *)&bindAddr);
LAB_0012a586:
      this_05 = (data_union *)&local_ep;
      *(undefined4 *)(pp_Var7 + 5) = 2;
      pp_Var7[6] = (_func_int *)(long)iVar3;
      (this->super_IUDPSender)._vptr_IUDPSender = pp_Var7;
LAB_0012a59c:
      *(undefined8 *)&((endpoint *)&(this_05->base).sa_family)->data_ = 0;
      Result::~Result((Result *)&this_05->base);
      this_06 = &bindAddr;
      goto LAB_0012a5ad;
    }
    this_02 = (basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>> *)
              (((tuple<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                 *)&this_00->ReadBufferAllocator)->
              super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
              ).
              super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
              ._M_head_impl;
    uVar4 = *(undefined4 *)(apiTonkSocket + 0x14);
    uVar5 = *(undefined4 *)(apiTonkSocket + 0x18);
    ec_1._M_value = 0;
    local_ep.impl_.data_.base.sa_family = 1;
    local_ep.impl_.data_.v4.sin_port = 0;
    ec_1._M_cat = local_1e0;
    asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
    set_option<asio::detail::socket_option::boolean<1,6>>(this_02,(boolean<1,_6> *)&local_ep,&ec_1);
    if (ec_1._M_value == 0) {
      local_ep.impl_.data_.base.sa_family = (sa_family_t)uVar4;
      local_ep.impl_.data_.v4.sin_port = (in_port_t)((uint)uVar4 >> 0x10);
      asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
      set_option<asio::detail::socket_option::integer<1,7>>
                (this_02,(integer<1,_7> *)&local_ep,&ec_1);
      if (ec_1._M_value != 0) {
        __rhs = "send_buffer_size";
        goto LAB_0012a728;
      }
      local_ep.impl_.data_.base.sa_family = (sa_family_t)uVar5;
      local_ep.impl_.data_.v4.sin_port = (in_port_t)((uint)uVar5 >> 0x10);
      asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
      set_option<asio::detail::socket_option::integer<1,8>>
                (this_02,(integer<1,_8> *)&local_ep,&ec_1);
      if (ec_1._M_value != 0) {
        __rhs = "receive_buffer_size";
        goto LAB_0012a728;
      }
      local_ep.impl_.data_.base.sa_family = 1;
      local_ep.impl_.data_.v4.sin_port = 0;
      asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
      set_option<asio::detail::socket_option::boolean<1,2>>
                (this_02,(boolean<1,_2> *)&local_ep,&ec_1);
      if (ec_1._M_value != 0) {
        __rhs = "reuse_address";
        goto LAB_0012a728;
      }
      bindAddr._0_8_ = (_func_int **)0x0;
    }
    else {
      __rhs = "broadcast=true";
LAB_0012a728:
      (**(code **)(*(long *)ec_1._M_cat + 0x20))(&local_1d8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_200.base,&local_1d8," from ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_ep,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_200.base,__rhs);
      lVar11 = (long)ec_1._M_value;
      puVar8 = (undefined8 *)operator_new(0x38);
      __len = 0x175f38;
      *puVar8 = "set_option";
      std::__cxx11::string::string((string *)(puVar8 + 1),(string *)&local_ep);
      *(undefined4 *)(puVar8 + 5) = 2;
      puVar8[6] = lVar11;
      bindAddr._0_8_ = puVar8;
      std::__cxx11::string::~string((string *)&local_ep);
      std::__cxx11::string::~string((string *)&local_200.base);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)bindAddr._0_8_;
    bindAddr.type_ = ipv4;
    bindAddr.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    Result::~Result((Result *)&bindAddr);
    if ((this->super_IUDPSender)._vptr_IUDPSender == (_func_int **)0x0) {
      asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::bind
                (&((((tuple<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                      *)&this_00->ReadBufferAllocator)->
                   super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                   ).
                   super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                  ._M_head_impl)->
                  super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,
                 (int)&local_228,(sockaddr *)&ec,__len);
      if (ec._M_value != 0) {
        (**(code **)(*(long *)ec._M_cat + 0x20))(&bindAddr);
        iVar3 = ec._M_value;
        pp_Var7 = (_func_int **)operator_new(0x38);
        *pp_Var7 = (_func_int *)"UDP socket bind failed";
        std::__cxx11::string::string((string *)(pp_Var7 + 1),(string *)&bindAddr);
        goto LAB_0012a586;
      }
      asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::
      local_endpoint(&local_ep,
                     &((((tuple<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                          *)&this_00->ReadBufferAllocator)->
                       super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                       ).
                       super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                      ._M_head_impl)->
                      super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                     ,&ec);
      if (ec._M_value == 0) {
        uVar2 = swap_bytes(local_ep.impl_.data_.v4.sin_port);
        *(undefined2 *)&deps[5].P2PKeyMap = uVar2;
        this_03 = (recursive_mutex *)deps[1].MappedPortPtr;
        local_200._0_8_ = this_03;
        std::recursive_mutex::lock(this_03);
        readBuffer = pktalloc::Allocator::Allocate((Allocator *)(this_03 + 1),0x546);
        Locker::~Locker((Locker *)&local_200.base);
        if (readBuffer == (uint8_t *)0x0) {
          Result::OutOfMemory();
          goto LAB_0012a478;
        }
        LOCK();
        piVar1 = (int *)((long)&((deps[1].IdMap)->IdLock).cs.super___recursive_mutex_base._M_mutex +
                        0x20);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
        postNextRead((UDPSocket *)deps,readBuffer);
        goto LAB_0012a5b2;
      }
      (**(code **)(*(long *)ec._M_cat + 0x20))(&bindAddr);
      p_Var9 = (_func_int *)(long)ec._M_value;
      pp_Var7 = (_func_int **)operator_new(0x38);
      *pp_Var7 = (_func_int *)"local_endpoint failed";
      std::__cxx11::string::string((string *)(pp_Var7 + 1),(string *)&bindAddr);
      *(undefined4 *)(pp_Var7 + 5) = 2;
      pp_Var7[6] = p_Var9;
      (this->super_IUDPSender)._vptr_IUDPSender = pp_Var7;
      this_05 = &local_200;
      goto LAB_0012a59c;
    }
  }
  else {
    asio::ip::make_address(&bindAddr,*(char **)(apiTonkSocket + 0x40),&ec);
    if (ec._M_value == 0) {
      asio::ip::detail::endpoint::endpoint(&local_ep.impl_,&bindAddr,local_260);
      local_228._M_dataplus._M_p =
           (pointer)CONCAT44(local_ep.impl_.data_.v6.sin6_flowinfo,
                             CONCAT22(local_ep.impl_.data_.v4.sin_port,
                                      local_ep.impl_.data_.base.sa_family));
      local_228.field_2._M_allocated_capacity._0_4_ = local_ep.impl_.data_._16_4_;
      local_228.field_2._M_allocated_capacity._4_4_ = (undefined4)local_ep.impl_.data_._20_8_;
      local_228.field_2._8_4_ = (undefined4)((ulong)local_ep.impl_.data_._20_8_ >> 0x20);
      local_228._M_string_length._0_4_ = local_ep.impl_.data_._8_4_;
      local_228._M_string_length._4_4_ = local_ep.impl_.data_._12_4_;
      bVar12 = local_ep.impl_.data_.base.sa_family == 2;
      pBVar10 = (BufferAllocator *)
                (((tuple<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                   *)&this_00->ReadBufferAllocator)->
                super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                ).
                super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                ._M_head_impl;
      goto LAB_0012a515;
    }
    (**(code **)(*(long *)ec._M_cat + 0x20))(&local_ep);
    p_Var9 = (_func_int *)(long)ec._M_value;
    pp_Var7 = (_func_int **)operator_new(0x38);
    *pp_Var7 = (_func_int *)"Provided InterfaceAddress was invalid";
    std::__cxx11::string::string((string *)(pp_Var7 + 1),(string *)&local_ep);
    *(undefined4 *)(pp_Var7 + 5) = 2;
    pp_Var7[6] = p_Var9;
    (this->super_IUDPSender)._vptr_IUDPSender = pp_Var7;
    local_200._0_8_ = (recursive_mutex *)0x0;
    Result::~Result((Result *)&local_200.base);
    this_06 = (address *)&local_ep;
LAB_0012a5ad:
    std::__cxx11::string::~string((string *)this_06);
  }
LAB_0012a5b2:
  if ((this->super_IUDPSender)._vptr_IUDPSender == (_func_int **)0x0) {
    return (Result)(ErrorResult *)this;
  }
LAB_0012a5bc:
  pBVar10 = deps[2].ReadBufferAllocator;
  Result::ToJson_abi_cxx11_(&local_228,(Result *)this);
  if ((pBVar10->AllocatorLock).cs.super___recursive_mutex_base._M_mutex.__data.__owner < 5) {
    bindAddr._0_8_ = (pBVar10->AllocatorLock).cs.super___recursive_mutex_base._M_mutex.__align;
    this_01 = (ostringstream *)(bindAddr.ipv6_address_.addr_.__in6_u.__u6_addr8 + 8);
    bindAddr.ipv6_address_.addr_.__in6_u.__u6_addr32[0] = 4;
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::operator<<((ostream *)this_01,
                    (string *)((pBVar10->Allocator).PreferredWindows.PreallocatedData + 1));
    std::operator<<((ostream *)this_01,"UDPSocket::Initialize failed: ");
    std::operator<<((ostream *)this_01,(string *)&local_228);
    this_04 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_04,(LogStringBuffer *)&bindAddr);
    std::__cxx11::ostringstream::~ostringstream(this_01);
  }
  std::__cxx11::string::~string((string *)&local_228);
  CloseSocket((UDPSocket *)deps);
  return (Result)(ErrorResult *)this;
}

Assistant:

Result UDPSocket::Initialize(
    const Dependencies& deps,
    IPVersion bindIPVersion,
    uint16_t port,
    const TonkSocketConfig* socketConfig,
    TonkSocket apiTonkSocket,
    std::shared_ptr<asio::io_context::strand> asioConnectStrand)
{
    Deps = deps;
    SocketConfig = socketConfig;
    APITonkSocket = apiTonkSocket;
    AsioConnectStrand = asioConnectStrand;
    TONK_DEBUG_ASSERT(asioConnectStrand != nullptr);
    SocketClosed = false;

#ifdef TONK_ENABLE_ARTIFICIAL_PACKETLOSS
#ifdef TONK_DEFAULT_ARTIFICIAL_PACKETLOSS
    SetArtificialPacketloss(TONK_DEFAULT_ARTIFICIAL_PACKETLOSS);
#endif
    ArtificialPacketlossPRNG.Seed(siamese::GetTimeUsec());
#endif

    Result result;

    try
    {
        result = FloodDetect.Initialize(
            socketConfig->MaximumClientsPerIP,
            socketConfig->MinuteFloodThresh
        );
        if (result.IsFail()) {
            goto OnError;
        }

        // Create a UDP socket for the connection attempt
        Socket = MakeUniqueNoThrow<asio::ip::udp::socket>(*Deps.Context);
        if (!Socket)
        {
            result = Result::OutOfMemory();
            goto OnError;
        }

        asio::error_code ec;

        // If application specified an interface address:
        UDPAddress bindAddress;
        if (socketConfig->InterfaceAddress)
        {
            // Convert provided interface address to Asio address
            asio::ip::address bindAddr = asio::ip::make_address(socketConfig->InterfaceAddress, ec);
            if (ec)
            {
                result = Result("Provided InterfaceAddress was invalid", ec.message(), ErrorType::Asio, ec.value());
                goto OnError;
            }

            // Bind to the provided interface address
            bindAddress = UDPAddress(bindAddr, port);
        }
        else
        {
            // Create an IPv4/IPv6 socket based on the server address type
            asio::ip::udp internet_protocol = (bindIPVersion == IPVersion::V4)
                ? asio::ip::udp::v4() : asio::ip::udp::v6();

            // Note: Asio default endpoint address is the any address e.g. INADDR_ANY
            bindAddress = UDPAddress(internet_protocol, port);
        }

        // Open socket
        Socket->open(bindAddress.protocol(), ec);
        if (ec)
        {
            result = Result("UDP socket open failed", ec.message(), ErrorType::Asio, ec.value());
            goto OnError;
        }

        // Set common socket options before bind
        result = SetUDPSocketOptions(
            *Socket,
            socketConfig->UDPSendBufferSizeBytes,
            socketConfig->UDPRecvBufferSizeBytes);
        if (result.IsFail()) {
            goto OnError;
        }

        // Bind socket
        Socket->bind(bindAddress, ec);
        if (ec)
        {
            result = Result("UDP socket bind failed", ec.message(), ErrorType::Asio, ec.value());
            goto OnError;
        }

        // Get local bound port
        const UDPAddress local_ep = Socket->local_endpoint(ec);
        if (ec)
        {
            result = Result("local_endpoint failed", ec.message(), ErrorType::Asio, ec.value());
            goto OnError;
        }
        LocalBoundPort = local_ep.port();

#ifdef TONK_DONT_FRAGMENT
        result = dontFragment(true);
        if (result.IsFail()) {
            goto OnError;
        }
#endif // TONK_DONT_FRAGMENT

#ifdef TONK_IGNORE_ICMP_UNREACHABLE
        result = ignoreUnreachable(true);
        if (result.IsFail()) {
            goto OnError;
        }
#endif // TONK_IGNORE_ICMP_UNREACHABLE

        // Allocate the first read buffer
        uint8_t* readBuffer = Deps.ReadBufferAllocator->Allocate(kReadBufferBytes);
        if (!readBuffer)
        {
            result = Result::OutOfMemory();
            goto OnError;
        }

        // Post the first read
        Deps.SocketRefCount->IncrementReferences();
        postNextRead(readBuffer);
    }
    catch (...)
    {
        TONK_DEBUG_BREAK(); // Should never happen except out of memory error
        result = Result("UDPSocket::CreateSocket", "Exception!", ErrorType::Asio);
    }

OnError:
    if (result.IsFail())
    {
        Deps.Logger->Error("UDPSocket::Initialize failed: ", result.ToJson());
        CloseSocket();
    }
    return result;
}